

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleValueHashTableOf.hpp
# Opt level: O3

void __thiscall
SimpleValueHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher>::removeAll
          (SimpleValueHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher> *this)

{
  ValueHashTableBucketElem<unsigned_int> *pVVar1;
  ulong uVar2;
  ValueHashTableBucketElem<unsigned_int> **ppVVar3;
  ValueHashTableBucketElem<unsigned_int> *pVVar4;
  ulong uVar5;
  
  uVar2 = this->fHashModulus;
  if (uVar2 != 0) {
    uVar5 = 0;
    do {
      ppVVar3 = this->fBucketList;
      pVVar4 = ppVVar3[uVar5];
      if (ppVVar3[uVar5] != (ValueHashTableBucketElem<unsigned_int> *)0x0) {
        do {
          pVVar1 = pVVar4->fNext;
          operator_delete(pVVar4,0x18);
          pVVar4 = pVVar1;
        } while (pVVar1 != (ValueHashTableBucketElem<unsigned_int> *)0x0);
        ppVVar3 = this->fBucketList;
        uVar2 = this->fHashModulus;
      }
      ppVVar3[uVar5] = (ValueHashTableBucketElem<unsigned_int> *)0x0;
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar2);
  }
  return;
}

Assistant:

void SimpleValueHashTableOf<TVal, THasher>::removeAll()
{
    // Clean up the buckets first
    for (XMLSize_t buckInd = 0; buckInd < fHashModulus; buckInd++)
    {
        // Get the bucket list head for this entry
        ValueHashTableBucketElem<TVal>* curElem = fBucketList[buckInd];
        ValueHashTableBucketElem<TVal>* nextElem;
        while (curElem)
        {
            // Save the next element before we hose this one
            nextElem = curElem->fNext;

            // delete the current element and move forward
            delete curElem;
            curElem = nextElem;
        }

        // Clean out this entry
        fBucketList[buckInd] = 0;
    }
}